

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_get_outgoing_locales(OPEN_HANDLE open,AMQP_VALUE *outgoing_locales_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE pAVar3;
  AMQP_VALUE single_amqp_value;
  ietf_language_tag pcStack_38;
  int get_single_value_result;
  ietf_language_tag outgoing_locales_single_value;
  AMQP_VALUE item_value;
  OPEN_INSTANCE *open_instance;
  uint32_t item_count;
  int result;
  AMQP_VALUE *outgoing_locales_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x60a;
  }
  else {
    item_value = (AMQP_VALUE)open;
    _item_count = outgoing_locales_value;
    outgoing_locales_value_local = &open->composite_value;
    iVar1 = amqpvalue_get_composite_item_count(open->composite_value,(uint32_t *)&open_instance);
    if (iVar1 == 0) {
      if ((uint)open_instance < 6) {
        open_instance._4_4_ = 0x618;
      }
      else {
        outgoing_locales_single_value =
             (ietf_language_tag)amqpvalue_get_composite_item_in_place(*(AMQP_VALUE *)item_value,5);
        if (((AMQP_VALUE)outgoing_locales_single_value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type((AMQP_VALUE)outgoing_locales_single_value),
           AVar2 == AMQP_TYPE_NULL)) {
          open_instance._4_4_ = 0x620;
        }
        else {
          AVar2 = amqpvalue_get_type((AMQP_VALUE)outgoing_locales_single_value);
          if (AVar2 == AMQP_TYPE_ARRAY) {
            memset(&stack0xffffffffffffffc8,0,8);
            single_amqp_value._4_4_ = 1;
          }
          else {
            single_amqp_value._4_4_ =
                 amqpvalue_get_symbol
                           ((AMQP_VALUE)outgoing_locales_single_value,&stack0xffffffffffffffc8);
          }
          AVar2 = amqpvalue_get_type((AMQP_VALUE)outgoing_locales_single_value);
          if (((AVar2 == AMQP_TYPE_ARRAY) &&
              (iVar1 = amqpvalue_get_array((AMQP_VALUE)outgoing_locales_single_value,_item_count),
              iVar1 == 0)) || (single_amqp_value._4_4_ == 0)) {
            AVar2 = amqpvalue_get_type((AMQP_VALUE)outgoing_locales_single_value);
            if (AVar2 == AMQP_TYPE_ARRAY) {
              open_instance._4_4_ = 0;
            }
            else {
              pAVar3 = amqpvalue_create_array();
              *_item_count = pAVar3;
              if (*_item_count == (AMQP_VALUE)0x0) {
                open_instance._4_4_ = 0x63c;
              }
              else {
                pAVar3 = amqpvalue_create_ietf_language_tag(pcStack_38);
                if (pAVar3 == (AMQP_VALUE)0x0) {
                  open_instance._4_4_ = 0x643;
                }
                else {
                  iVar1 = amqpvalue_add_array_item(*_item_count,pAVar3);
                  if (iVar1 == 0) {
                    iVar1 = amqpvalue_set_composite_item(*(AMQP_VALUE *)item_value,5,*_item_count);
                    if (iVar1 == 0) {
                      open_instance._4_4_ = 0;
                    }
                    else {
                      open_instance._4_4_ = 0x64f;
                    }
                  }
                  else {
                    open_instance._4_4_ = 0x649;
                  }
                  amqpvalue_destroy(pAVar3);
                }
                amqpvalue_destroy(*_item_count);
              }
            }
          }
          else {
            open_instance._4_4_ = 0x633;
          }
        }
      }
    }
    else {
      open_instance._4_4_ = 0x612;
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_get_outgoing_locales(OPEN_HANDLE open, AMQP_VALUE* outgoing_locales_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        if (amqpvalue_get_composite_item_count(open_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 5)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(open_instance->composite_value, 5);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    ietf_language_tag outgoing_locales_single_value;
                    int get_single_value_result;
                    if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                    {
                        get_single_value_result = amqpvalue_get_ietf_language_tag(item_value, &outgoing_locales_single_value);
                    }
                    else
                    {
                        (void)memset((void*)&outgoing_locales_single_value, 0, sizeof(outgoing_locales_single_value));
                        get_single_value_result = 1;
                    }

                    if (((amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY) || (amqpvalue_get_array(item_value, outgoing_locales_value) != 0)) &&
                        (get_single_value_result != 0))
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_ARRAY)
                        {
                            *outgoing_locales_value = amqpvalue_create_array();
                            if (*outgoing_locales_value == NULL)
                            {
                                result = MU_FAILURE;
                            }
                            else
                            {
                                AMQP_VALUE single_amqp_value = amqpvalue_create_ietf_language_tag(outgoing_locales_single_value);
                                if (single_amqp_value == NULL)
                                {
                                    result = MU_FAILURE;
                                }
                                else
                                {
                                    if (amqpvalue_add_array_item(*outgoing_locales_value, single_amqp_value) != 0)
                                    {
                                        result = MU_FAILURE;
                                    }
                                    else
                                    {
                                        if (amqpvalue_set_composite_item(open_instance->composite_value, 5, *outgoing_locales_value) != 0)
                                        {
                                            result = MU_FAILURE;
                                        }
                                        else
                                        {
                                            result = 0;
                                        }
                                    }

                                    amqpvalue_destroy(single_amqp_value);
                                }
                                amqpvalue_destroy(*outgoing_locales_value);
                            }
                        }
                        else
                        {
                            result = 0;
                        }
                    }
                }
            }
        }
    }

    return result;
}